

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall
HighsDomain::updateThresholdLbChange
          (HighsDomain *this,HighsInt col,double newbound,double val,double *threshold)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double local_18 [3];
  
  dVar1 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  if ((dVar1 != newbound) || (NAN(dVar1) || NAN(newbound))) {
    local_18[2] = ((this->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
    dVar4 = local_18[2];
    if ((this->mipsolver->model_->integrality_).
        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
        super__Vector_impl_data._M_start[col] == kContinuous) {
      dVar5 = (dVar1 - newbound) * 0.3;
      dVar4 = local_18[2] * 1000.0;
      if (local_18[2] * 1000.0 <= dVar5) {
        dVar4 = dVar5;
      }
    }
    pdVar2 = local_18;
    local_18[0] = *threshold;
    local_18[1] = ABS(val) * ((dVar1 - newbound) - dVar4);
    lVar3 = 8;
    do {
      if (*pdVar2 <= *(double *)((long)local_18 + lVar3) &&
          *(double *)((long)local_18 + lVar3) != *pdVar2) {
        pdVar2 = (double *)((long)local_18 + lVar3);
      }
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x18);
    *threshold = *pdVar2;
  }
  return;
}

Assistant:

void HighsDomain::updateThresholdLbChange(HighsInt col, double newbound,
                                          double val, double& threshold) {
  if (newbound != col_upper_[col]) {
    double thresholdNew =
        std::fabs(val) * boundRange(col_upper_[col], newbound,
                                    mipsolver->mipdata_->feastol,
                                    variableType(col));

    // the new threshold is now the maximum of the new threshold and the current
    // one
    threshold =
        std::max({threshold, thresholdNew, mipsolver->mipdata_->feastol});
  }
}